

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O3

int USHAInput(USHAContext *ctx,uint8_t *bytes,uint bytecount)

{
  int iVar1;
  
  if (ctx != (USHAContext *)0x0) {
    switch(ctx->whichSha) {
    case 0:
      iVar1 = SHA1Input(&(ctx->ctx).sha1Context,bytes,bytecount);
      return iVar1;
    case 1:
      iVar1 = SHA224Input(&(ctx->ctx).sha224Context,bytes,bytecount);
      return iVar1;
    case 2:
      iVar1 = SHA256Input(&(ctx->ctx).sha256Context,bytes,bytecount);
      return iVar1;
    case 3:
      iVar1 = SHA384Input(&(ctx->ctx).sha384Context,bytes,bytecount);
      return iVar1;
    case 4:
      iVar1 = SHA512Input(&(ctx->ctx).sha512Context,bytes,bytecount);
      return iVar1;
    default:
      return 4;
    }
  }
  return 1;
}

Assistant:

int USHAInput(USHAContext *ctx,
    const uint8_t *bytes, unsigned int bytecount)
{
    if (ctx) {
        switch (ctx->whichSha) {
        case SHA1:
            return SHA1Input((SHA1Context*)&ctx->ctx, bytes, bytecount);
        case SHA224:
            return SHA224Input((SHA224Context*)&ctx->ctx, bytes,
                bytecount);
        case SHA256:
            return SHA256Input((SHA256Context*)&ctx->ctx, bytes,
                bytecount);
        case SHA384:
            return SHA384Input((SHA384Context*)&ctx->ctx, bytes,
                bytecount);
        case SHA512:
            return SHA512Input((SHA512Context*)&ctx->ctx, bytes,
                bytecount);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}